

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceptor.cpp
# Opt level: O2

int __thiscall booster::aio::acceptor::listen(acceptor *this,int __fd,int __n)

{
  int iVar1;
  int iVar2;
  system_error *this_00;
  error_code eVar3;
  error_code e;
  
  e._M_value = 0;
  e._M_cat = (error_category *)std::_V2::system_category();
  iVar2 = listen(this,__fd,(int)&e);
  iVar1 = e._M_value;
  if (e._M_value == 0) {
    return iVar2;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x40);
  eVar3._4_4_ = 0;
  eVar3._M_value = iVar1;
  eVar3._M_cat = e._M_cat;
  system::system_error::system_error(this_00,eVar3);
  __cxa_throw(this_00,&system::system_error::typeinfo,system::system_error::~system_error);
}

Assistant:

void acceptor::listen(int backlog)
{
	system::error_code e;
	listen(backlog,e);
	if(e)
		throw system::system_error(e);
}